

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastMdS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  bool bVar1;
  uint uVar2;
  uint *puVar3;
  MessageLite **ppMVar4;
  TcParseTableBase *pTVar5;
  MessageLite *pMVar6;
  ulong uVar7;
  string *psVar8;
  char *pcVar9;
  ushort *puVar10;
  int v1;
  Arena *arena;
  ushort *local_48 [2];
  undefined4 local_34;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar9 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar9;
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar3 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar3 = *puVar3 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  ppMVar4 = RefAt<google::protobuf::MessageLite*>(msg,(ulong)data.field_0 >> 0x30);
  pTVar5 = MessageLite::GetTcParseTable
                     (*(MessageLite **)
                       ((long)&table->has_bits_offset +
                       ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset));
  if (*ppMVar4 == (MessageLite *)0x0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar6 = ClassData::New(pTVar5->class_data,arena);
    *ppMVar4 = pMVar6;
  }
  local_48[0] = (ushort *)(ptr + 1);
  ReadSize((char **)local_48);
  if ((local_48[0] != (ushort *)0x0) && (0 < ctx->depth_)) {
    EpsCopyInputStream::PushLimit
              ((EpsCopyInputStream *)&stack0xffffffffffffffcc,(char *)ctx,(int)local_48[0]);
    v1 = ctx->depth_ + -1;
    ctx->depth_ = v1;
    if (local_48[0] != (ushort *)0x0) {
      pMVar6 = *ppMVar4;
      while (bVar1 = ParseContext::Done(ctx,(char **)local_48), !bVar1) {
        uVar2 = (uint)pTVar5->fast_idx_mask & (uint)*local_48[0];
        if ((uVar2 & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x44d);
        }
        uVar7 = (ulong)(uVar2 & 0xfffffff8);
        local_48[0] = (ushort *)
                      (**(code **)(&pTVar5[1].has_bits_offset + uVar7))
                                (pMVar6,local_48[0],ctx,
                                 (ulong)*local_48[0] ^
                                 *(ulong *)(&pTVar5[1].fast_idx_mask + uVar7 * 2),pTVar5,0);
        if ((local_48[0] == (ushort *)0x0) ||
           ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
      }
      puVar10 = local_48[0];
      if ((pTVar5->field_0x9 & 1) != 0) {
        puVar10 = (ushort *)(*pTVar5->post_loop_handler)(pMVar6,(char *)local_48[0],ctx);
      }
      if ((puVar10 != (ushort *)0x0) &&
         (psVar8 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                             (v1,ctx->depth_,"old_depth == depth_"), psVar8 != (string *)0x0)) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,1099,psVar8->_M_string_length,(psVar8->_M_dataplus)._M_p);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_48);
      }
      ctx->depth_ = ctx->depth_ + 1;
      local_48[0] = (ushort *)CONCAT44(local_48[0]._4_4_,local_34);
      bVar1 = EpsCopyInputStream::PopLimit(&ctx->super_EpsCopyInputStream,(LimitToken *)local_48);
      if (!bVar1) {
        return (char *)0x0;
      }
      return (char *)puVar10;
    }
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMdS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint8_t, false, false>(
      PROTOBUF_TC_PARAM_PASS);
}